

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O2

void chrono::utils::AddCapsuleGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,double radius,
               double hlen,ChVector<double> *pos,ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  element_type *peVar1;
  shared_ptr<chrono::ChCapsuleShape> capsule;
  shared_ptr<chrono::ChVisualModel> model;
  __shared_ptr<chrono::ChCapsuleShape,_(__gnu_cxx::_Lock_policy)2> local_130;
  double local_120;
  double local_118;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *local_110;
  shared_ptr<chrono::ChVisualShape> local_108;
  undefined1 local_f8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_c8;
  ChFrame<double> local_b8;
  
  local_120 = radius;
  local_118 = hlen;
  local_110 = &vis_material->
               super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &local_130,
             &(body->collision_model).
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>);
  peVar1 = local_130._M_ptr;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *)
             (local_f8 + 0x10),
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  ChMatrix33<double>::Set_A_quaternion((ChMatrix33<double> *)&local_b8,rot);
  (*(peVar1->super_ChVisualShape)._vptr_ChVisualShape[0xb])
            (local_120,local_118,peVar1,local_f8 + 0x10,pos,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
  if (visualization) {
    ChPhysicsItem::GetVisualModel((ChPhysicsItem *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.coord);
    if ((element_type *)local_b8._vptr_ChFrame == (element_type *)0x0) {
      std::make_shared<chrono::ChVisualModel>();
      std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_c8,
                 (__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
      ChPhysicsItem::AddVisualModel
                (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)&local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.coord);
    }
    chrono_types::make_shared<chrono::ChCapsuleShape,_0>();
    ((local_130._M_ptr)->gcapsule).rad = local_120;
    ((local_130._M_ptr)->gcapsule).hlen = local_118;
    std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d8,local_110);
    ChVisualShape::AddMaterial
              (&(local_130._M_ptr)->super_ChVisualShape,
               (shared_ptr<chrono::ChVisualMaterial> *)&local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
    ChPhysicsItem::GetVisualModel((ChPhysicsItem *)local_f8);
    std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChCapsuleShape,void>
              ((__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> *)&local_108,
               &local_130);
    ChFrame<double>::ChFrame(&local_b8,pos,rot);
    ChVisualModel::AddShape((ChVisualModel *)local_f8._0_8_,&local_108,&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_108.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
  }
  return;
}

Assistant:

void AddCapsuleGeometry(ChBody* body,
                        std::shared_ptr<ChMaterialSurface> material,
                        double radius,
                        double hlen,
                        const ChVector<>& pos,
                        const ChQuaternion<>& rot,
                        bool visualization,
                        std::shared_ptr<ChVisualMaterial> vis_material) {
    body->GetCollisionModel()->AddCapsule(material, radius, hlen, pos, rot);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto capsule = chrono_types::make_shared<ChCapsuleShape>();
        capsule->GetCapsuleGeometry().rad = radius;
        capsule->GetCapsuleGeometry().hlen = hlen;
        capsule->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(capsule, ChFrame<>(pos, rot));
    }
}